

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlAttrSerializeTxtContent(xmlBufferPtr buf,xmlDocPtr doc,xmlAttrPtr attr,xmlChar *string)

{
  xmlBufPtr buf_00;
  xmlBufPtr buffer;
  xmlChar *string_local;
  xmlAttrPtr attr_local;
  xmlDocPtr doc_local;
  xmlBufferPtr buf_local;
  
  if (((buf != (xmlBufferPtr)0x0) && (string != (xmlChar *)0x0)) &&
     (buf_00 = xmlBufFromBuffer(buf), buf_00 != (xmlBufPtr)0x0)) {
    xmlBufAttrSerializeTxtContent(buf_00,doc,attr,string);
    xmlBufBackToBuffer(buf_00);
  }
  return;
}

Assistant:

void
xmlAttrSerializeTxtContent(xmlBufferPtr buf, xmlDocPtr doc,
                           xmlAttrPtr attr, const xmlChar * string)
{
    xmlBufPtr buffer;

    if ((buf == NULL) || (string == NULL))
        return;
    buffer = xmlBufFromBuffer(buf);
    if (buffer == NULL)
        return;
    xmlBufAttrSerializeTxtContent(buffer, doc, attr, string);
    xmlBufBackToBuffer(buffer);
}